

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::setFilterMode(QFutureInterfaceBase *this,bool enable)

{
  long lVar1;
  bool bVar2;
  ResultStoreBase *this_00;
  byte in_SIL;
  QFutureInterfaceBase *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffa8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar2 = hasException(in_RDI);
  if (!bVar2) {
    this_00 = resultStoreBase(in_RDI);
    QtPrivate::ResultStoreBase::setFilterMode(this_00,(bool)(in_SIL & 1));
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setFilterMode(bool enable)
{
    QMutexLocker locker(&d->m_mutex);
    if (!hasException())
        resultStoreBase().setFilterMode(enable);
}